

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

IDiagObjectAddress * __thiscall
Js::RecyclableProtoObjectWalker::FindPropertyAddress
          (RecyclableProtoObjectWalker *this,PropertyId propId,bool *isConst)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  IDiagObjectAddress *pIVar6;
  long *plVar7;
  undefined4 local_78 [2];
  ResolvedObject resolvedProto;
  AutoCleanup autoCleanup;
  undefined8 *puVar5;
  
  local_78[0] = 0xffffffff;
  resolvedProto.name._4_1_ = 0;
  resolvedProto.propId = 0;
  resolvedProto._4_4_ = 0;
  resolvedProto.scriptContext = (ScriptContext *)0x0;
  resolvedProto.address = (IDiagObjectAddress *)0x0;
  resolvedProto.objectDisplay = (IDiagObjectModelDisplay *)0x0;
  resolvedProto.obj = (Var)0x0;
  resolvedProto.originalObj = (Var)0x0;
  (*(this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
    _vptr_IDiagObjectModelWalkerBase[2])(this,local_78);
  resolvedProto.typeId = TypeIds_Undefined;
  resolvedProto.isConst = false;
  resolvedProto._61_3_ = 0;
  if (resolvedProto.address == (IDiagObjectAddress *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd91,"(resolvedProto.objectDisplay)","resolvedProto.objectDisplay"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar3 = (*(resolvedProto.address)->_vptr_IDiagObjectAddress[7])();
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  resolvedProto._56_8_ = puVar5;
  bVar2 = Memory::ReferencedArenaAdapter::AddStrongReference((ReferencedArenaAdapter *)*puVar5);
  pIVar6 = (IDiagObjectAddress *)0x0;
  plVar7 = (long *)0x0;
  if (bVar2) {
    plVar7 = (long *)puVar5[1];
  }
  if (plVar7 != (long *)0x0) {
    pIVar6 = (IDiagObjectAddress *)(**(code **)(*plVar7 + 0x18))(plVar7,propId,isConst);
  }
  FindPropertyAddress::AutoCleanup::~AutoCleanup((AutoCleanup *)&resolvedProto.typeId);
  return pIVar6;
}

Assistant:

IDiagObjectAddress* RecyclableProtoObjectWalker::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        ResolvedObject resolvedProto;
        GetGroupObject(&resolvedProto);

        struct AutoCleanup
        {
            WeakArenaReference<Js::IDiagObjectModelWalkerBase> * walkerRef;
            IDiagObjectModelWalkerBase * walker;

            AutoCleanup() : walkerRef(nullptr), walker(nullptr) {};
            ~AutoCleanup()
            {
                if (walker)
                {
                    walkerRef->ReleaseStrongReference();
                }
                if (walkerRef)
                {
                    HeapDelete(walkerRef);
                }
            }
        } autoCleanup;
        Assert(resolvedProto.objectDisplay);
        autoCleanup.walkerRef = resolvedProto.objectDisplay->CreateWalker();
        autoCleanup.walker = autoCleanup.walkerRef->GetStrongReference();
        return autoCleanup.walker ? autoCleanup.walker->FindPropertyAddress(propId, isConst) : nullptr;
    }